

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O2

REF_STATUS ref_facelift_tattle(REF_GRID ref_grid,REF_INT node)

{
  uint uVar1;
  int iVar2;
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift;
  REF_DBL *pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_INT RVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  char *pcVar10;
  ulong uVar11;
  REF_INT tuv_sense;
  REF_INT cell;
  REF_DBL faceuv [2];
  REF_DBL params [2];
  REF_DBL xyz [3];
  REF_DBL bary [3];
  REF_INT local_118;
  REF_INT RStack_114;
  REF_INT local_110;
  REF_INT local_10c;
  REF_INT tri_nodes [27];
  
  ref_geom = ref_grid->geom;
  ref_facelift = ref_geom->ref_facelift;
  if ((ref_facelift != (REF_FACELIFT)0x0) && (ref_facelift->displacement == (REF_DBL *)0x0)) {
    pRVar3 = ref_grid->node->real;
    lVar8 = (long)(node * 0xf);
    printf(" facelift tattle on node = %d at %f %f %f\n",pRVar3[lVar8],pRVar3[lVar8 + 1],
           pRVar3[lVar8 + 2]);
    uVar11 = 0xffffffff;
    RVar6 = -1;
    if (-1 < node) {
      pRVar4 = ref_geom->ref_adj;
      uVar11 = 0xffffffff;
      RVar6 = -1;
      if (node < pRVar4->nnode) {
        uVar1 = pRVar4->first[(uint)node];
        uVar11 = 0xffffffff;
        RVar6 = -1;
        if ((long)(int)uVar1 != -1) {
          RVar6 = pRVar4->item[(int)uVar1].ref;
          uVar11 = (ulong)uVar1;
        }
      }
    }
    while( true ) {
      if ((int)uVar11 == -1) break;
      iVar2 = ref_geom->descr[RVar6 * 6];
      uVar1 = ref_geom->descr[RVar6 * 6 + 1];
      if (iVar2 == 2) {
        params[0] = ref_geom->param[RVar6 * 2];
        params[1] = ref_geom->param[RVar6 * 2 + 1];
        uVar7 = ref_facelift_eval_at(ref_facelift,2,uVar1,params,xyz,(REF_DBL *)0x0);
        if (uVar7 != 0) {
          pcVar10 = "eval";
          uVar9 = 0xde;
LAB_00119488:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,uVar9,"ref_facelift_tattle",(ulong)uVar7,pcVar10);
          return uVar7;
        }
        uVar7 = ref_facelift_enclosing(ref_facelift,2,uVar1,params,&cell,bary);
        if (uVar7 != 0) {
          pcVar10 = "enclose";
          uVar9 = 0xe0;
          goto LAB_00119488;
        }
        printf("tri id %d xyz %f %f %f uv %f %f\n",xyz[0],xyz[1],xyz[2],params[0],params[1],
               (ulong)uVar1);
        uVar7 = ref_cell_nodes(ref_facelift->tri_cell,cell,tri_nodes);
        if (uVar7 != 0) {
          pcVar10 = "edg tri nodes";
          uVar9 = 0xe4;
          goto LAB_00119488;
        }
        local_118 = tri_nodes[0];
        RStack_114 = tri_nodes[1];
        local_110 = tri_nodes[2];
        local_10c = tri_nodes[ref_facelift->tri_cell->node_per];
        uVar7 = ref_geom_cell_tuv(ref_geom,(REF_INT)tri_nodes._0_8_,&local_118,2,faceuv,&tuv_sense);
        if (uVar7 != 0) {
          pcVar10 = "face uv";
          uVar9 = 0xec;
          goto LAB_00119488;
        }
        printf("bary[0] %f uv %f %f\n",bary[0],faceuv[0],faceuv[1]);
        uVar7 = ref_geom_cell_tuv(ref_geom,RStack_114,&local_118,2,faceuv,&tuv_sense);
        if (uVar7 != 0) {
          pcVar10 = "face uv";
          uVar9 = 0xf0;
          goto LAB_00119488;
        }
        printf("bary[1] %f uv %f %f\n",bary[1],faceuv[0],faceuv[1]);
        uVar7 = ref_geom_cell_tuv(ref_geom,local_110,&local_118,2,faceuv,&tuv_sense);
        if (uVar7 != 0) {
          pcVar10 = "face uv";
          uVar9 = 0xf4;
          goto LAB_00119488;
        }
        printf("bary[2] %f uv %f %f\n",bary[2],faceuv[0],faceuv[1]);
      }
      else if (iVar2 == 1) {
        params[0] = ref_geom->param[RVar6 * 2];
        uVar7 = ref_facelift_eval_at(ref_facelift,1,uVar1,params,xyz,(REF_DBL *)0x0);
        if (uVar7 != 0) {
          pcVar10 = "eval";
          uVar9 = 0xd4;
          goto LAB_00119488;
        }
        uVar7 = ref_facelift_enclosing(ref_facelift,1,uVar1,params,&cell,bary);
        if (uVar7 != 0) {
          pcVar10 = "enclose";
          uVar9 = 0xd6;
          goto LAB_00119488;
        }
        printf("edg id %d xyz %f %f %f bary %f %f\n",xyz[0],xyz[1],xyz[2],bary[0],bary[1],
               (ulong)uVar1);
      }
      pRVar5 = ref_geom->ref_adj->item;
      uVar11 = (ulong)pRVar5[(int)uVar11].next;
      RVar6 = -1;
      if (uVar11 != 0xffffffffffffffff) {
        RVar6 = pRVar5[uVar11].ref;
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_tattle(REF_GRID ref_grid, REF_INT node) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACELIFT ref_facelift = ref_geom_facelift(ref_geom);
  REF_INT item, geom;
  REF_INT type, id;
  REF_DBL params[2];
  REF_DBL bary[3];
  REF_INT cell;
  REF_DBL xyz[3], faceuv[2];
  REF_INT linear_nodes[REF_CELL_MAX_SIZE_PER], tuv_sense;
  REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == ref_facelift) return REF_SUCCESS;
  if (!ref_facelift_direct(ref_facelift)) return REF_SUCCESS;

  printf(" facelift tattle on node = %d at %f %f %f\n", node,
         ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
         ref_node_xyz(ref_node, 2, node));
  each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item, geom) {
    type = ref_geom_type(ref_geom, geom);
    id = ref_geom_id(ref_geom, geom);
    switch (type) {
      case REF_GEOM_EDGE:
        params[0] = ref_geom_param(ref_geom, 0, geom);
        RSS(ref_facelift_eval_at(ref_facelift, type, id, params, xyz, NULL),
            "eval");
        RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
            "enclose");
        printf("edg id %d xyz %f %f %f bary %f %f\n", id, xyz[0], xyz[1],
               xyz[2], bary[0], bary[1]);
        break;
      case REF_GEOM_FACE:
        params[0] = ref_geom_param(ref_geom, 0, geom);
        params[1] = ref_geom_param(ref_geom, 1, geom);
        RSS(ref_facelift_eval_at(ref_facelift, type, id, params, xyz, NULL),
            "eval");
        RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
            "enclose");
        printf("tri id %d xyz %f %f %f uv %f %f\n", id, xyz[0], xyz[1], xyz[2],
               params[0], params[1]);
        RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cell, tri_nodes),
            "edg tri nodes");
        linear_nodes[0] = tri_nodes[0];
        linear_nodes[1] = tri_nodes[1];
        linear_nodes[2] = tri_nodes[2];
        linear_nodes[3] =
            tri_nodes[ref_cell_id_index(ref_facelift_tri(ref_facelift))];
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[0], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[0] %f uv %f %f\n", bary[0], faceuv[0], faceuv[1]);
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[1], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[1] %f uv %f %f\n", bary[1], faceuv[0], faceuv[1]);
        RSS(ref_geom_cell_tuv(ref_geom, linear_nodes[2], linear_nodes,
                              REF_GEOM_FACE, faceuv, &tuv_sense),
            "face uv");
        printf("bary[2] %f uv %f %f\n", bary[2], faceuv[0], faceuv[1]);

        break;
    }
  }

  return REF_SUCCESS;
}